

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  ssize_t sVar1;
  int *piVar2;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  char *in_RDI;
  int unaff_retaddr;
  string *in_stack_00000008;
  ssize_t write_result;
  size_t local_20;
  void *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  do {
    while( true ) {
      if (local_20 == 0) {
        Status::OK();
        return (Status)in_RDI;
      }
      sVar1 = write(*(int *)(in_RSI + 0x10010),local_18,local_20);
      if (sVar1 < 0) break;
      local_18 = (void *)(sVar1 + (long)local_18);
      local_20 = local_20 - sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  __errno_location();
  PosixError(in_stack_00000008,unaff_retaddr);
  return (Status)in_RDI;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }